

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O0

Ref cashew::ValueBuilder::makeCall(Ref target)

{
  Value *pVVar1;
  Ref RVar2;
  Ref local_20;
  Ref local_18;
  Ref target_local;
  
  local_18.inst = target.inst;
  local_20 = makeRawArray(3);
  pVVar1 = Ref::operator->(&local_20);
  RVar2 = makeRawString((IString *)&CALL);
  pVVar1 = Value::push_back(pVVar1,RVar2);
  pVVar1 = Value::push_back(pVVar1,local_18);
  RVar2 = makeRawArray(0);
  pVVar1 = Value::push_back(pVVar1,RVar2);
  Ref::Ref(&target_local,pVVar1);
  return (Ref)target_local.inst;
}

Assistant:

static Ref makeCall(Ref target) {
    return &makeRawArray(3)
              ->push_back(makeRawString(CALL))
              .push_back(target)
              .push_back(makeRawArray());
  }